

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O3

SRes crnlib::LzmaEnc_CodeOneBlock
               (CLzmaEnc *p,Bool useLimits,UInt32 maxPackSize,UInt32 maxUnpackSize)

{
  byte bVar1;
  byte bVar2;
  UInt16 *pUVar3;
  ushort uVar4;
  CRangeEnc *pCVar5;
  CRangeEnc *p_00;
  UInt16 (*paUVar6) [64];
  byte bVar7;
  UInt32 UVar8;
  uint uVar9;
  uint uVar10;
  UInt32 UVar11;
  UInt32 UVar12;
  uint uVar13;
  SRes SVar14;
  Byte *pBVar15;
  undefined8 uVar16;
  COptimal *pCVar17;
  uint uVar18;
  UInt32 *pUVar19;
  undefined1 *puVar20;
  ulong uVar21;
  COptimal *pCVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  Byte *pBVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  Byte *pBVar32;
  uint uVar33;
  ulong uVar34;
  long lVar35;
  UInt32 (*paUVar36) [272];
  long lVar37;
  UInt32 m_2;
  uint uVar38;
  ulong uVar39;
  UInt32 m_1;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  UInt32 m;
  bool bVar43;
  int iVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  int iVar56;
  int iVar58;
  undefined1 auVar57 [16];
  int iVar60;
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  UInt32 numPairs;
  UInt32 numPairs_1;
  UInt32 repLens [4];
  UInt32 local_23c;
  ulong local_238;
  uint local_22c;
  ulong local_228;
  UInt32 *local_220;
  ulong local_218;
  COptimal *local_210;
  ulong local_208;
  long local_200;
  Byte *local_1f8;
  long local_1f0;
  uint local_1e4;
  ulong local_1e0;
  ulong local_1d8;
  CRangeEnc *local_1d0;
  UInt16 (*local_1c8) [16];
  ulong local_1c0;
  uint local_1b8 [3];
  UInt32 UStack_1ac;
  UInt16 *local_1a0;
  ulong local_198;
  Byte *local_190;
  ulong local_188;
  ulong local_180;
  uint local_178;
  UInt32 local_174;
  uint local_170;
  uint local_16c;
  UInt32 (*local_168) [272];
  UInt16 (*local_160) [16];
  ulong local_158;
  UInt16 (*local_150) [16];
  COptimal *local_148;
  ulong local_140;
  UInt32 *local_138;
  uint local_12c;
  UInt32 *local_128;
  ulong local_120;
  ulong local_118;
  UInt32 (*local_110) [272];
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  UInt16 *local_f0;
  ulong local_e8;
  ulong local_e0;
  uint local_d4;
  UInt32 local_d0;
  Bool local_cc;
  uint local_c8 [4];
  UInt16 *local_b8;
  UInt32 (*local_b0) [128];
  UInt32 (*local_a8) [64];
  UInt32 *local_a0;
  UInt32 *local_98;
  UInt16 *local_90;
  UInt16 *local_88;
  UInt16 *local_80;
  ulong local_78;
  undefined8 local_70;
  CLenPriceEnc *local_68;
  UInt16 *local_60;
  UInt16 (*local_58) [64];
  CLenPriceEnc *local_50;
  Byte *local_48;
  ulong local_40;
  ulong local_38;
  undefined4 extraout_var;
  
  local_d0 = maxUnpackSize;
  local_cc = useLimits;
  if (p->inStream != (ISeqInStream *)0x0) {
    (p->matchFinderBase).stream = p->inStream;
    (*(p->matchFinder).Init)(p->matchFinderObj);
    p->inStream = (ISeqInStream *)0x0;
  }
  if (p->finished != 0 || p->result != 0) {
    return p->result;
  }
  if ((p->rc).res == 0) {
    if ((p->matchFinderBase).result == 0) {
      local_f8 = p->nowPos64;
      uVar39 = local_f8 & 0xffffffff;
      if (local_f8 == 0) {
        UVar8 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
        if (UVar8 == 0) {
          UVar8 = (UInt32)local_f8;
          goto LAB_0019b8c2;
        }
        ReadMatchDistances(p,local_1b8);
        RangeEnc_EncodeBit(&p->rc,p->isMatch[p->state],0);
        p->state = *(UInt32 *)(kLiteralNextStates + (ulong)p->state * 4);
        bVar7 = (*(p->matchFinder).GetIndexByte)(p->matchFinderObj,-p->additionalOffset);
        pUVar3 = p->litProbs;
        uVar10 = bVar7 | 0x100;
        do {
          RangeEnc_EncodeBit(&p->rc,(UInt16 *)((ulong)(uVar10 >> 7 & 0x1fffffe) + (long)pUVar3),
                             uVar10 >> 7 & 1);
          bVar43 = uVar10 < 0x8000;
          uVar10 = uVar10 * 2;
        } while (bVar43);
        p->additionalOffset = p->additionalOffset - 1;
        uVar39 = 1;
      }
      UVar8 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
      if (UVar8 != 0) {
        local_98 = &p->numPairs;
        local_138 = p->reps;
        local_210 = p->opt;
        local_220 = p->ProbPrices;
        local_1c8 = p->isMatch;
        local_f0 = p->isRep;
        local_1a0 = p->isRepG0;
        local_160 = p->isRep0Long;
        local_128 = p->opt[0].backs;
        local_110 = (p->repLenEnc).prices;
        local_168 = (p->lenEnc).prices;
        local_a8 = p->posSlotPrices;
        local_b0 = p->distancesPrices;
        local_1d0 = &p->rc;
        local_50 = &p->lenEnc;
        local_58 = p->posSlotEncoder;
        local_88 = p->posAlignEncoder;
        local_90 = p->posEncoders;
        local_60 = p->isRepG1;
        local_80 = p->isRepG2;
        local_68 = &p->repLenEnc;
        local_a0 = p->ProbPrices + 0x7d;
        local_b8 = (p->repLenEnc).p.high + 0xfc;
        local_148 = p->opt + 4;
        local_48 = (Byte *)(ulong)maxPackSize;
        do {
          do {
            local_218 = uVar39;
            if (p->fastMode == 0) {
              uVar10 = p->optimumCurrentIndex;
              if (p->optimumEndIndex == uVar10) {
                p->optimumEndIndex = 0;
                p->optimumCurrentIndex = 0;
                if (p->additionalOffset == 0) {
                  UVar8 = ReadMatchDistances(p,&local_16c);
                }
                else {
                  UVar8 = p->longestMatchLength;
                  local_16c = p->numPairs;
                }
                uVar10 = p->numAvail;
                uVar28 = 0xffffffff;
                if (uVar10 < 2) {
LAB_001995bf:
                  uVar34 = 1;
                }
                else {
                  uVar38 = 0x111;
                  if (uVar10 < 0x111) {
                    uVar38 = uVar10;
                  }
                  pBVar15 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                  bVar7 = pBVar15[-1];
                  if (uVar38 < 4) {
                    uVar38 = 3;
                  }
                  uVar42 = *(ulong *)local_138;
                  local_1b8[0] = (uint)uVar42;
                  local_1b8[1] = (uint)(uVar42 >> 0x20);
                  local_1b8[2] = (uint)*(ulong *)(local_138 + 2);
                  UStack_1ac = (UInt32)(*(ulong *)(local_138 + 2) >> 0x20);
                  uVar34 = 0;
                  uVar28 = 0;
                  do {
                    if ((bVar7 == pBVar15[~(ulong)(local_138[uVar34] + 1)]) &&
                       (lVar31 = -(ulong)(local_138[uVar34] + 1), *pBVar15 == pBVar15[lVar31])) {
                      uVar25 = 2;
                      if (uVar10 != 2) {
                        uVar24 = 2;
                        do {
                          uVar25 = uVar24;
                          if (pBVar15[uVar24 - 1] != pBVar15[uVar24 + lVar31 + -1]) break;
                          uVar24 = uVar24 + 1;
                          uVar25 = (ulong)uVar38;
                        } while (uVar38 != uVar24);
                      }
                      local_c8[uVar34] = (uint)uVar25;
                      if (local_c8[uVar28] < (uint)uVar25) {
                        uVar28 = uVar34 & 0xffffffff;
                      }
                    }
                    else {
                      local_c8[uVar34] = 0;
                    }
                    uVar34 = uVar34 + 1;
                  } while (uVar34 != 4);
                  uVar10 = local_c8[uVar28];
                  uVar34 = (ulong)uVar10;
                  if (uVar10 < p->numFastBytes) {
                    if (UVar8 < p->numFastBytes) {
                      bVar1 = pBVar15[~(ulong)(local_1b8[0] + 1)];
                      if (((uVar10 < 2) && (UVar8 < 2)) && (bVar7 != bVar1)) {
                        local_23c = 0xffffffff;
                        uVar28 = 0xffffffff;
                        goto LAB_0019957c;
                      }
                      uVar25 = (ulong)p->state;
                      p->opt[0].state = p->state;
                      bVar2 = (byte)p->lc;
                      uVar10 = p->pbMask & (uint)uVar39;
                      uVar24 = (ulong)uVar10;
                      uVar38 = (uint)(local_1c8[uVar25][uVar24] >> 4);
                      UVar12 = p->ProbPrices[uVar38];
                      local_200 = CONCAT71(local_200._1_7_,bVar1);
                      local_238 = uVar34;
                      local_180 = uVar25;
                      local_108 = uVar42 & 0xffffffff;
                      if (uVar25 < 7) {
                        UVar11 = 0;
                        uVar40 = bVar7 + 0x100;
                        do {
                          UVar11 = UVar11 + local_220[((uint)(int)(char)uVar40 >> 7 & 0x7f0 ^
                                                      (uint)(p->litProbs +
                                                            ((uint)(pBVar15[-2] >>
                                                                   (8 - bVar2 & 0x1f)) +
                                                            ((p->lpMask & (uint)uVar39) <<
                                                            (bVar2 & 0x1f))) * 0x300)[uVar40 >> 8])
                                                      >> 4];
                          bVar43 = uVar40 < 0x8000;
                          uVar40 = uVar40 * 2;
                        } while (bVar43);
                      }
                      else {
                        UVar11 = LitEnc_GetPriceMatched
                                           (p->litProbs +
                                            ((uint)(pBVar15[-2] >> (8 - bVar2 & 0x1f)) +
                                            ((p->lpMask & (uint)uVar39) << (bVar2 & 0x1f))) * 0x300,
                                            (uint)bVar7,(uint)bVar1,local_220);
                      }
                      pUVar3 = local_b8;
                      auVar63 = _DAT_001a2020;
                      auVar62 = _DAT_001a2010;
                      auVar61 = _DAT_001a2000;
                      uVar40 = UVar11 + UVar12;
                      p->opt[1].price = uVar40;
                      p->opt[1].backPrev = 0xffffffff;
                      p->opt[1].prev1IsChar = 0;
                      local_228 = CONCAT44(local_228._4_4_,p->ProbPrices[uVar38 ^ 0x7f]);
                      iVar29 = *(int *)((long)p->ProbPrices +
                                       (ulong)(p->isRep[local_180] >> 2 & 0xfffffffc ^ 0x1fc)) +
                               p->ProbPrices[uVar38 ^ 0x7f];
                      uVar28 = 0xffffffff;
                      if ((bVar7 == (byte)local_200) &&
                         (uVar38 = local_220[local_1a0[local_180] >> 4] + iVar29 +
                                   local_220[local_160[uVar25][uVar24] >> 4], uVar38 < uVar40)) {
                        p->opt[1].price = uVar38;
                        p->opt[1].backPrev = 0;
                        uVar28 = 0;
                      }
                      uVar38 = (uint)local_238;
                      local_238 = local_238 & 0xffffffff;
                      if (uVar38 < UVar8) {
                        local_238 = (ulong)UVar8;
                      }
                      if (1 < (uint)local_238) {
                        p->opt[1].posPrev = 0;
                        uVar39 = *(ulong *)(local_138 + 2);
                        *(ulong *)local_128 = *(ulong *)local_138;
                        *(ulong *)(local_128 + 2) = uVar39;
                        uVar39 = (ulong)((uint)local_238 - 1);
                        lVar31 = uVar39 - 1;
                        auVar59._8_4_ = (int)lVar31;
                        auVar59._0_8_ = lVar31;
                        auVar59._12_4_ = (int)((ulong)lVar31 >> 0x20);
                        pCVar22 = local_210 + local_238;
                        uVar34 = 0;
                        do {
                          auVar49._8_4_ = (int)uVar34;
                          auVar49._0_8_ = uVar34;
                          auVar49._12_4_ = (int)(uVar34 >> 0x20);
                          auVar57 = (auVar49 | auVar62) ^ auVar63;
                          iVar27 = SUB164(auVar59 ^ auVar63,0);
                          bVar43 = iVar27 < auVar57._0_4_;
                          iVar48 = SUB164(auVar59 ^ auVar63,4);
                          iVar55 = auVar57._4_4_;
                          if ((bool)(~(iVar48 < iVar55 || iVar55 == iVar48 && bVar43) & 1)) {
                            pCVar22->price = 0x40000000;
                          }
                          if (iVar48 >= iVar55 && (iVar55 != iVar48 || !bVar43)) {
                            pCVar22[-1].price = 0x40000000;
                          }
                          auVar49 = (auVar49 | auVar61) ^ auVar63;
                          iVar55 = auVar49._4_4_;
                          if (iVar55 <= iVar48 && (iVar55 != iVar48 || auVar49._0_4_ <= iVar27)) {
                            pCVar22[-2].price = 0x40000000;
                            pCVar22[-3].price = 0x40000000;
                          }
                          uVar34 = uVar34 + 4;
                          pCVar22 = pCVar22 + -4;
                        } while ((uVar39 + 3 & 0xfffffffffffffffc) != uVar34);
                        local_200 = uVar24 * 0x440;
                        lVar31 = 0;
                        paUVar36 = local_168;
                        pCVar22 = local_210;
                        do {
                          uVar39 = (ulong)local_c8[lVar31];
                          if (1 < uVar39) {
                            UVar12 = GetPureRepPrice(p,(UInt32)lVar31,p->state,uVar10);
                            pCVar17 = local_210 + uVar39;
                            do {
                              uVar39 = uVar39 - 1;
                              uVar38 = *(int *)(pUVar3 + uVar24 * 0x220 + uVar39 * 2 + 2) +
                                       UVar12 + iVar29;
                              if (uVar38 < pCVar17->price) {
                                pCVar17->price = uVar38;
                                pCVar17->posPrev = 0;
                                pCVar17->backPrev = (UInt32)lVar31;
                                pCVar17->prev1IsChar = 0;
                              }
                              pCVar17 = pCVar17 + -1;
                              paUVar36 = local_168;
                              pCVar22 = local_210;
                            } while ((uVar39 & 0xfffffffe) != 0);
                          }
                          lVar31 = lVar31 + 1;
                        } while (lVar31 != 4);
                        uVar39 = (ulong)(local_c8[0] + 1);
                        if (local_c8[0] < 2) {
                          uVar39 = 2;
                        }
                        if ((uint)uVar39 <= UVar8) {
                          UVar8 = p->ProbPrices[p->isRep[p->state] >> 4];
                          uVar34 = 0xfffffffe;
                          do {
                            uVar34 = (ulong)((int)uVar34 + 2);
                          } while (p->matches[uVar34] < (uint)uVar39);
                          while( true ) {
                            uVar10 = p->matches[(int)uVar34 + 1];
                            uVar38 = (uint)uVar39;
                            uVar40 = 3;
                            if (uVar38 < 5) {
                              uVar40 = uVar38 - 2;
                            }
                            if ((ulong)uVar10 < 0x80) {
                              UVar12 = local_b0[uVar40][uVar10];
                            }
                            else {
                              iVar29 = 6;
                              if (-1 < (int)(uVar10 - 0x80000)) {
                                iVar29 = 0x12;
                              }
                              UVar12 = local_a8[uVar40]
                                       [(uint)p->g_FastPos[uVar10 >> (sbyte)iVar29] + iVar29 * 2] +
                                       p->alignPrices[uVar10 & 0xf];
                              paUVar36 = local_168;
                            }
                            uVar40 = *(int *)((long)*paUVar36 + (ulong)(uVar38 - 2) * 4 + local_200)
                                     + (int)local_228 + UVar8 + UVar12;
                            if (uVar40 < pCVar22[uVar39].price) {
                              pCVar17 = pCVar22 + uVar39;
                              pCVar17->price = uVar40;
                              pCVar17->posPrev = 0;
                              pCVar17->backPrev = uVar10 + 4;
                              pCVar17->prev1IsChar = 0;
                            }
                            uVar10 = (int)uVar34 + 2;
                            if ((uVar38 == p->matches[uVar34]) && (uVar10 == local_16c)) break;
                            if (uVar38 == p->matches[uVar34]) {
                              uVar34 = (ulong)uVar10;
                            }
                            uVar39 = (ulong)(uVar38 + 1);
                          }
                        }
                        local_100 = (ulong)((int)local_218 + 1);
                        local_1e0 = 0xffe;
                        lVar31 = 1;
                        uVar34 = 0;
                        local_118 = local_218 & 0xffffffff;
                        do {
                          uVar28 = local_118;
                          uVar39 = local_218;
                          uVar42 = local_118 & 0xffffffff;
                          uVar10 = (int)uVar34 + 1;
                          uVar25 = (ulong)uVar10;
                          local_1f0 = lVar31;
                          local_1d8 = uVar34;
                          UVar8 = ReadMatchDistances(p,&local_170);
                          uVar16 = CONCAT44(extraout_var,UVar8);
                          if (p->numFastBytes <= UVar8) {
                            p->numPairs = local_170;
                            p->longestMatchLength = UVar8;
                            break;
                          }
                          pCVar22 = local_210 + uVar25;
                          uVar10 = local_210[uVar25].posPrev;
                          uVar39 = (ulong)uVar10;
                          local_228 = uVar25;
                          local_70 = uVar16;
                          if (local_210[uVar25].prev1IsChar == 0) {
                            uVar38 = local_210[uVar39].state;
                            uVar34 = (ulong)uVar38;
                            if (uVar10 == (uint)local_1d8) goto LAB_0019a163;
LAB_0019a19a:
                            uVar40 = pCVar22->backPrev;
                            if (3 < uVar40) {
                              uVar10 = *(uint *)(kMatchNextStates + (ulong)uVar38 * 4);
                              goto LAB_0019a21f;
                            }
                            uVar10 = *(uint *)(kRepNextStates + (ulong)uVar38 * 4);
LAB_0019a1a8:
                            local_1b8[0] = local_210[uVar39].backs[uVar40];
                            uVar34 = (ulong)local_1b8[0];
                            if (uVar40 == 0) {
                              iVar29 = 1;
                            }
                            else {
                              memcpy(local_1b8 + 1,local_128 + uVar39 * 0xc,(ulong)uVar40 * 4);
                              if (2 < uVar40) goto LAB_0019a293;
                              iVar29 = uVar40 + 1;
                            }
                            memcpy((void *)((long)local_1b8 + (ulong)(uint)(iVar29 << 2)),
                                   (void *)((long)local_128 +
                                           (ulong)(uint)(iVar29 << 2) + uVar39 * 0x30),
                                   (ulong)(uVar40 * -4 + 0xc));
                            uVar34 = (ulong)local_1b8[0];
                          }
                          else {
                            uVar10 = uVar10 - 1;
                            if (pCVar22->prev2 == 0) {
                              uVar39 = (ulong)uVar10;
                              uVar38 = *(uint *)(kLiteralNextStates +
                                                (ulong)local_210[uVar39].state * 4);
                              uVar34 = (ulong)uVar38;
                              if (uVar10 != (uint)local_1d8) goto LAB_0019a19a;
                            }
                            else {
                              uVar39 = (ulong)pCVar22->posPrev2;
                              uVar40 = pCVar22->backPrev2;
                              puVar20 = kMatchNextStates;
                              if (uVar40 < 4) {
                                puVar20 = kRepNextStates;
                              }
                              uVar34 = (ulong)*(uint *)(kLiteralNextStates +
                                                       (ulong)*(uint *)(puVar20 +
                                                                       (ulong)local_210[uVar39].
                                                                              state * 4) * 4);
                              if (uVar10 != (uint)local_1d8) {
                                uVar10 = *(uint *)(kRepNextStates + uVar34 * 4);
                                if (uVar40 < 4) goto LAB_0019a1a8;
LAB_0019a21f:
                                local_1b8[0] = uVar40 - 4;
                                UStack_1ac = local_128[uVar39 * 0xc + 2];
                                local_1b8[1] = (uint)*(undefined8 *)(local_128 + uVar39 * 0xc);
                                local_1b8[2] = (uint)((ulong)*(undefined8 *)
                                                              (local_128 + uVar39 * 0xc) >> 0x20);
                                uVar34 = (ulong)local_1b8[0];
                                goto LAB_0019a293;
                              }
                            }
LAB_0019a163:
                            if (pCVar22->backPrev == 0) {
                              puVar20 = kShortRepNextStates;
                            }
                            else {
                              puVar20 = kLiteralNextStates;
                            }
                            uVar10 = *(uint *)(puVar20 + uVar34 * 4);
                            uVar34 = local_108;
                          }
LAB_0019a293:
                          uVar38 = (int)uVar28 + 1;
                          pCVar22->state = uVar10;
                          pCVar22->backs[0] = (UInt32)uVar34;
                          *(ulong *)(pCVar22->backs + 1) = CONCAT44(local_1b8[2],local_1b8[1]);
                          pCVar22->backs[3] = UStack_1ac;
                          UVar8 = pCVar22->price;
                          local_158 = uVar42;
                          local_1f8 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                          local_190 = local_1f8 + -1;
                          bVar7 = local_1f8[-1];
                          local_180 = (ulong)bVar7;
                          local_208 = (ulong)((UInt32)uVar34 + 1);
                          local_188 = (ulong)(p->pbMask & uVar38);
                          uVar39 = (ulong)uVar10;
                          local_150 = local_1c8 + uVar39;
                          uVar4 = (*local_150)[local_188] >> 4;
                          bVar1 = (byte)p->lc;
                          UVar12 = p->ProbPrices[uVar4];
                          local_1c0 = CONCAT44(local_1c0._4_4_,(uint)local_190[-local_208]);
                          local_198 = uVar39;
                          local_118 = (ulong)uVar38;
                          local_108 = uVar34;
                          local_200._0_4_ = UVar8;
                          if (uVar10 < 7) {
                            UVar11 = 0;
                            uVar10 = bVar7 + 0x100;
                            do {
                              UVar11 = UVar11 + local_220[((uint)(int)(char)uVar10 >> 7 & 0x7f0 ^
                                                          (uint)(p->litProbs +
                                                                ((uint)(local_1f8[-2] >>
                                                                       (8 - bVar1 & 0x1f)) +
                                                                ((p->lpMask & uVar38) <<
                                                                (bVar1 & 0x1f))) * 0x300)
                                                                [uVar10 >> 8]) >> 4];
                              bVar43 = uVar10 < 0x8000;
                              uVar10 = uVar10 * 2;
                            } while (bVar43);
                          }
                          else {
                            UVar11 = LitEnc_GetPriceMatched
                                               (p->litProbs +
                                                ((uint)(local_1f8[-2] >> (8 - bVar1 & 0x1f)) +
                                                ((p->lpMask & uVar38) << (bVar1 & 0x1f))) * 0x300,
                                                (uint)bVar7,(uint)local_190[-local_208],local_220);
                          }
                          pUVar3 = local_b8;
                          uVar28 = local_188;
                          auVar63 = _DAT_001a2020;
                          auVar62 = _DAT_001a2010;
                          auVar61 = _DAT_001a2000;
                          uVar41 = UVar12 + UVar8 + UVar11;
                          uVar40 = (int)local_1d8 + 2;
                          pCVar22 = local_210 + uVar40;
                          uVar10 = local_210[uVar40].price;
                          bVar43 = uVar41 < uVar10;
                          uVar38 = (uint)local_228;
                          if (bVar43) {
                            pCVar22->price = uVar41;
                            pCVar22->posPrev = uVar38;
                            pCVar22->backPrev = 0xffffffff;
                            pCVar22->prev1IsChar = 0;
                            uVar4 = (*local_150)[local_188] >> 4;
                            uVar10 = uVar41;
                          }
                          iVar29 = (UInt32)local_200 + local_220[uVar4 ^ 0x7f];
                          local_200 = CONCAT44(local_200._4_4_,iVar29);
                          local_1e4 = *(int *)((long)local_220 +
                                              (ulong)(local_f0[local_198] >> 2 & 0xfffffffc ^ 0x1fc)
                                              ) + iVar29;
                          if (((char)local_1c0 == (char)local_180) &&
                             (((uVar38 <= pCVar22->posPrev || (pCVar22->backPrev != 0)) &&
                              (uVar9 = local_220[local_1a0[local_198] >> 4] + local_1e4 +
                                       local_220[local_160[uVar39][local_188] >> 4], uVar9 <= uVar10
                              )))) {
                            pCVar22->price = uVar9;
                            pCVar22->posPrev = uVar38;
                            pCVar22->backPrev = 0;
                            pCVar22->prev1IsChar = 0;
                            bVar43 = true;
                          }
                          uVar39 = local_1e0 & 0xffffffff;
                          uVar10 = p->numAvail;
                          local_120 = (ulong)uVar10;
                          uVar9 = 0xffe - (int)local_1d8;
                          if (uVar10 <= uVar9) {
                            uVar9 = uVar10;
                          }
                          lVar31 = local_1f0;
                          uVar34 = local_228;
                          if (1 < uVar9) {
                            uVar30 = p->numFastBytes;
                            uVar42 = (ulong)uVar30;
                            uVar13 = uVar30;
                            if (uVar9 < uVar30) {
                              uVar13 = uVar9;
                            }
                            local_d4 = (uint)local_1e0;
                            if (!bVar43 && (char)local_1c0 != (char)local_180) {
                              uVar18 = uVar30 + 1;
                              uVar23 = uVar9;
                              if (uVar18 < uVar9) {
                                uVar23 = uVar18;
                              }
                              if (1 < uVar23) {
                                uVar23 = local_d4;
                                if (uVar10 < local_d4) {
                                  uVar23 = uVar10;
                                }
                                if (uVar18 <= uVar23) {
                                  uVar23 = uVar18;
                                }
                                uVar25 = uVar39;
                                if (local_120 < uVar39) {
                                  uVar25 = local_120;
                                }
                                if (uVar18 <= uVar25) {
                                  uVar25 = (ulong)uVar18;
                                }
                                uVar24 = 1;
                                do {
                                  uVar21 = uVar24;
                                  if (local_1f8[uVar24 - 1] != local_1f8[uVar24 + (-1 - local_208)])
                                  break;
                                  uVar24 = uVar24 + 1;
                                  uVar21 = (ulong)uVar23;
                                } while (uVar25 != uVar24);
                                iVar29 = (int)uVar21;
                                if (1 < iVar29 - 1U) {
                                  uVar33 = (int)local_158 + 2U & p->pbMask;
                                  uVar23 = *(uint *)(kLiteralNextStates + local_198 * 4);
                                  iVar27 = *(int *)((long)p->ProbPrices +
                                                   (ulong)(local_1c8[uVar23][uVar33] >> 2 &
                                                           0xfffffffc ^ 0x1fc));
                                  iVar48 = *(int *)((long)p->ProbPrices +
                                                   (ulong)(p->isRep[uVar23] >> 2 & 0xfffffffc ^
                                                          0x1fc));
                                  uVar18 = (iVar29 - 1U) + uVar40;
                                  if ((uint)local_238 < uVar18) {
                                    uVar25 = local_238 & 0xffffffff;
                                    local_238 = (ulong)(uVar38 + iVar29);
                                    lVar37 = local_238 - uVar25;
                                    lVar35 = lVar37 + -1;
                                    auVar57._8_4_ = (int)lVar35;
                                    auVar57._0_8_ = lVar35;
                                    auVar57._12_4_ = (int)((ulong)lVar35 >> 0x20);
                                    pCVar22 = local_148 + uVar25;
                                    uVar25 = 0;
                                    do {
                                      auVar50._8_4_ = (int)uVar25;
                                      auVar50._0_8_ = uVar25;
                                      auVar50._12_4_ = (int)(uVar25 >> 0x20);
                                      auVar59 = (auVar50 | auVar62) ^ auVar63;
                                      iVar55 = SUB164(auVar57 ^ auVar63,0);
                                      bVar43 = iVar55 < auVar59._0_4_;
                                      iVar56 = SUB164(auVar57 ^ auVar63,4);
                                      iVar58 = auVar59._4_4_;
                                      if ((bool)(~(iVar56 < iVar58 || iVar58 == iVar56 && bVar43) &
                                                1)) {
                                        pCVar22[-3].price = 0x40000000;
                                      }
                                      if (iVar56 >= iVar58 && (iVar58 != iVar56 || !bVar43)) {
                                        pCVar22[-2].price = 0x40000000;
                                      }
                                      auVar59 = (auVar50 | auVar61) ^ auVar63;
                                      iVar58 = auVar59._4_4_;
                                      if (iVar58 <= iVar56 &&
                                          (iVar58 != iVar56 || auVar59._0_4_ <= iVar55)) {
                                        pCVar22[-1].price = 0x40000000;
                                        pCVar22->price = 0x40000000;
                                      }
                                      uVar25 = uVar25 + 4;
                                      pCVar22 = pCVar22 + 4;
                                    } while ((lVar37 + 3U & 0xfffffffffffffffc) != uVar25);
                                  }
                                  uVar38 = iVar27 + uVar41 + iVar48 + local_110[uVar33][iVar29 - 3]
                                           + local_220[local_1a0[uVar23] >> 4] +
                                           *(int *)((long)local_220 +
                                                   (ulong)(local_160[uVar23][uVar33] >> 2 &
                                                           0xfffffffc ^ 0x1fc));
                                  if (uVar38 < local_210[uVar18].price) {
                                    pCVar22 = local_210 + uVar18;
                                    pCVar22->price = uVar38;
                                    pCVar22->posPrev = uVar40;
                                    pCVar22->backPrev = 0;
                                    pCVar22->prev1IsChar = 1;
                                    pCVar22->prev2 = 0;
                                  }
                                }
                              }
                            }
                            if (uVar10 < uVar30) {
                              uVar30 = uVar10;
                            }
                            local_78 = (ulong)uVar30;
                            if (local_d4 <= uVar30) {
                              local_78 = uVar39;
                            }
                            if (uVar10 < local_d4) {
                              local_d4 = uVar10;
                            }
                            local_e0 = local_120;
                            if (uVar42 < local_120) {
                              local_e0 = uVar42;
                            }
                            if (uVar39 <= local_e0) {
                              local_e0 = uVar39;
                            }
                            local_180 = local_188 * 0x440;
                            uVar25 = 2;
                            lVar35 = 0;
                            pBVar15 = local_1f8;
                            pBVar32 = local_190;
                            pCVar22 = local_210;
                            local_22c = uVar13;
                            local_1e0 = uVar39;
                            local_158 = uVar42;
                            local_12c = uVar9;
                            do {
                              pBVar26 = pBVar32 + -(ulong)(local_1b8[lVar35] + 1);
                              if ((*pBVar32 == *pBVar26) && (*pBVar15 == pBVar26[1])) {
                                uVar39 = 2;
                                if (2 < uVar13) {
                                  uVar42 = 2;
                                  do {
                                    uVar39 = uVar42;
                                    if (pBVar15[uVar42 - 1] !=
                                        pBVar15[uVar42 + (-1 - (ulong)(local_1b8[lVar35] + 1))])
                                    break;
                                    uVar42 = uVar42 + 1;
                                    uVar39 = local_78;
                                  } while (local_e0 != uVar42);
                                }
                                iVar29 = (int)uVar39;
                                uVar38 = iVar29 + (UInt32)uVar34;
                                local_150 = (UInt16 (*) [16])(ulong)uVar38;
                                uVar10 = (uint)local_238;
                                if ((uint)local_238 < uVar38) {
                                  uVar42 = local_238 & 0xffffffff;
                                  lVar31 = ~uVar42 + (ulong)uVar38;
                                  auVar44._8_4_ = (int)lVar31;
                                  auVar44._0_8_ = lVar31;
                                  auVar44._12_4_ = (int)((ulong)lVar31 >> 0x20);
                                  pCVar22 = local_148 + uVar42;
                                  uVar24 = 0;
                                  do {
                                    auVar51._8_4_ = (int)uVar24;
                                    auVar51._0_8_ = uVar24;
                                    auVar51._12_4_ = (int)(uVar24 >> 0x20);
                                    auVar59 = (auVar51 | auVar62) ^ auVar63;
                                    iVar27 = SUB164(auVar44 ^ auVar63,0);
                                    bVar43 = iVar27 < auVar59._0_4_;
                                    iVar48 = SUB164(auVar44 ^ auVar63,4);
                                    iVar55 = auVar59._4_4_;
                                    if ((bool)(~(iVar48 < iVar55 || iVar55 == iVar48 && bVar43) & 1)
                                       ) {
                                      pCVar22[-3].price = 0x40000000;
                                    }
                                    if (iVar48 >= iVar55 && (iVar55 != iVar48 || !bVar43)) {
                                      pCVar22[-2].price = 0x40000000;
                                    }
                                    auVar59 = (auVar51 | auVar61) ^ auVar63;
                                    iVar55 = auVar59._4_4_;
                                    if (iVar55 <= iVar48 &&
                                        (iVar55 != iVar48 || auVar59._0_4_ <= iVar27)) {
                                      pCVar22[-1].price = 0x40000000;
                                      pCVar22->price = 0x40000000;
                                    }
                                    uVar24 = uVar24 + 4;
                                    pCVar22 = pCVar22 + 4;
                                    uVar10 = uVar38;
                                  } while (((long)local_150 + (3 - uVar42) & 0xfffffffffffffffc) !=
                                           uVar24);
                                }
                                local_1c0 = CONCAT44(local_1c0._4_4_,uVar10);
                                UVar12 = (UInt32)lVar35;
                                local_208 = uVar25;
                                UVar8 = GetPureRepPrice(p,UVar12,(UInt32)local_198,(UInt32)local_188
                                                       );
                                iVar27 = UVar8 + local_1e4;
                                uVar39 = uVar39 & 0xffffffff;
                                uVar42 = uVar39;
                                do {
                                  uVar10 = *(int *)(pUVar3 + uVar28 * 0x220 + uVar42 * 2) + iVar27;
                                  uVar38 = (int)local_1f0 + (int)uVar42;
                                  if (uVar10 < local_210[uVar38].price) {
                                    pCVar22 = local_210 + uVar38;
                                    pCVar22->price = uVar10;
                                    pCVar22->posPrev = (UInt32)uVar34;
                                    pCVar22->backPrev = UVar12;
                                    pCVar22->prev1IsChar = 0;
                                  }
                                  uVar42 = uVar42 - 1;
                                } while ((uVar42 & 0xfffffffe) != 0);
                                uVar10 = iVar29 + 1;
                                local_208 = local_208 & 0xffffffff;
                                if (lVar35 == 0) {
                                  local_208 = (ulong)uVar10;
                                }
                                uVar40 = (int)local_158 + iVar29 + 1;
                                uVar38 = local_12c;
                                if (uVar40 < local_12c) {
                                  uVar38 = uVar40;
                                }
                                uVar34 = (ulong)uVar10;
                                if (uVar10 < uVar38) {
                                  uVar38 = uVar40;
                                  if (local_d4 < uVar40) {
                                    uVar38 = local_d4;
                                  }
                                  uVar42 = local_1e0;
                                  if (local_120 < local_1e0) {
                                    uVar42 = local_120;
                                  }
                                  uVar25 = (ulong)uVar10;
                                  if (uVar40 <= uVar42) {
                                    uVar42 = (ulong)uVar40;
                                  }
                                  do {
                                    uVar34 = uVar25;
                                    if (local_190[uVar25] != pBVar26[uVar25]) break;
                                    uVar25 = uVar25 + 1;
                                    uVar34 = (ulong)uVar38;
                                  } while (uVar42 != uVar25);
                                }
                                uVar10 = (int)uVar34 - uVar10;
                                if (uVar10 < 2) {
                                  local_238 = local_1c0 & 0xffffffff;
                                  pBVar15 = local_1f8;
                                  uVar25 = local_208;
                                  pBVar32 = local_190;
                                  lVar31 = local_1f0;
                                  pCVar22 = local_210;
                                  uVar34 = local_228;
                                  auVar61 = _DAT_001a2000;
                                  auVar62 = _DAT_001a2010;
                                  auVar63 = _DAT_001a2020;
                                  uVar13 = local_22c;
                                }
                                else {
                                  local_38 = (ulong)*(uint *)(kRepNextStates + local_198 * 4);
                                  uVar38 = iVar29 + (int)local_118;
                                  local_178 = p->pbMask;
                                  local_140 = CONCAT44(local_140._4_4_,
                                                       *(undefined4 *)
                                                        ((long)*local_110 +
                                                        (ulong)(iVar29 - 2) * 4 + local_180));
                                  bVar7 = (byte)p->lc;
                                  local_174 = p->ProbPrices
                                              [local_1c8[local_38][local_178 & uVar38] >> 4];
                                  local_e8 = (ulong)uVar10;
                                  local_40 = uVar39;
                                  UVar8 = LitEnc_GetPriceMatched
                                                    (p->litProbs +
                                                     ((uint)(local_190[iVar29 - 1] >>
                                                            (8 - bVar7 & 0x1f)) +
                                                     ((uVar38 & p->lpMask) << (bVar7 & 0x1f))) *
                                                     0x300,(uint)local_190[uVar39],
                                                     (uint)pBVar26[uVar39],local_220);
                                  auVar63 = _DAT_001a2020;
                                  auVar62 = _DAT_001a2010;
                                  auVar61 = _DAT_001a2000;
                                  uVar10 = *(uint *)(kLiteralNextStates + local_38 * 4);
                                  uVar40 = (int)local_118 + iVar29 + 1U & local_178;
                                  uVar38 = *(uint *)((long)p->ProbPrices +
                                                    (ulong)(local_1c8[uVar10][uVar40] >> 2 &
                                                            0xfffffffc ^ 0x1fc));
                                  iVar48 = *(int *)((long)p->ProbPrices +
                                                   (ulong)(p->isRep[uVar10] >> 2 & 0xfffffffc ^
                                                          0x1fc));
                                  uVar41 = (int)local_150 + (int)local_e8 + 1;
                                  UVar11 = (UInt32)local_228;
                                  uVar39 = local_1c0 & 0xffffffff;
                                  if ((uint)local_1c0 < uVar41) {
                                    uVar39 = (ulong)((int)uVar34 + UVar11);
                                    lVar31 = ~(local_1c0 & 0xffffffff) + uVar39;
                                    auVar45._8_4_ = (int)lVar31;
                                    auVar45._0_8_ = lVar31;
                                    auVar45._12_4_ = (int)((ulong)lVar31 >> 0x20);
                                    uVar34 = (ulong)(iVar29 + UVar11);
                                    if ((ulong)(iVar29 + UVar11) < (local_238 & 0xffffffff)) {
                                      uVar34 = local_238 & 0xffffffff;
                                    }
                                    pCVar22 = local_148 + uVar34;
                                    uVar42 = 0;
                                    do {
                                      auVar52._8_4_ = (int)uVar42;
                                      auVar52._0_8_ = uVar42;
                                      auVar52._12_4_ = (int)(uVar42 >> 0x20);
                                      auVar59 = (auVar52 | auVar62) ^ auVar63;
                                      iVar29 = SUB164(auVar45 ^ auVar63,0);
                                      bVar43 = iVar29 < auVar59._0_4_;
                                      iVar55 = SUB164(auVar45 ^ auVar63,4);
                                      iVar56 = auVar59._4_4_;
                                      if ((bool)(~(iVar55 < iVar56 || iVar56 == iVar55 && bVar43) &
                                                1)) {
                                        pCVar22[-3].price = 0x40000000;
                                      }
                                      if (iVar55 >= iVar56 && (iVar56 != iVar55 || !bVar43)) {
                                        pCVar22[-2].price = 0x40000000;
                                      }
                                      auVar59 = (auVar52 | auVar61) ^ auVar63;
                                      iVar56 = auVar59._4_4_;
                                      if (iVar56 <= iVar55 &&
                                          (iVar56 != iVar55 || auVar59._0_4_ <= iVar29)) {
                                        pCVar22[-1].price = 0x40000000;
                                        pCVar22->price = 0x40000000;
                                      }
                                      uVar42 = uVar42 + 4;
                                      pCVar22 = pCVar22 + 4;
                                      local_178 = uVar38;
                                    } while (((uVar39 - uVar34) + 3 & 0xfffffffffffffffc) != uVar42)
                                    ;
                                  }
                                  local_238 = uVar39;
                                  uVar10 = (int)local_140 + iVar27 + local_174 + UVar8 + iVar48 +
                                           uVar38 + local_110[uVar40][(int)local_e8 - 2] +
                                           local_220[local_1a0[uVar10] >> 4] +
                                           *(int *)((long)local_220 +
                                                   (ulong)(local_160[uVar10][uVar40] >> 2 &
                                                           0xfffffffc ^ 0x1fc));
                                  pBVar15 = local_1f8;
                                  uVar25 = local_208;
                                  pBVar32 = local_190;
                                  lVar31 = local_1f0;
                                  pCVar22 = local_210;
                                  uVar34 = local_228;
                                  uVar13 = local_22c;
                                  if (uVar10 < local_210[uVar41].price) {
                                    pCVar17 = local_210 + uVar41;
                                    pCVar17->price = uVar10;
                                    pCVar17->posPrev = (int)local_150 + 1;
                                    pCVar17->backPrev = 0;
                                    pCVar17->prev1IsChar = 1;
                                    pCVar17->prev2 = 1;
                                    pCVar17->posPrev2 = UVar11;
                                    pCVar17->backPrev2 = UVar12;
                                  }
                                }
                              }
                              lVar35 = lVar35 + 1;
                            } while (lVar35 != 4);
                            uVar10 = (uint)local_70;
                            uVar38 = uVar10;
                            if (uVar13 < uVar10) {
                              local_170 = 0;
                              do {
                                uVar38 = local_170;
                                local_170 = uVar38 + 2;
                              } while (p->matches[uVar38] < uVar13);
                              p->matches[uVar38] = uVar13;
                              uVar38 = uVar13;
                            }
                            uVar39 = local_1e0;
                            if ((uint)uVar25 <= uVar38) {
                              local_200 = CONCAT44(local_200._4_4_,
                                                   (UInt32)local_200 +
                                                   local_220[local_f0[local_198] >> 4]);
                              iVar29 = (int)uVar34;
                              if ((uint)local_238 < uVar38 + iVar29) {
                                uVar39 = local_238 & 0xffffffff;
                                if ((uint)local_120 <= uVar10) {
                                  uVar10 = (uint)local_120;
                                }
                                if ((uint)local_158 <= uVar10) {
                                  uVar10 = (uint)local_158;
                                }
                                uVar40 = (uint)local_1e0;
                                uVar38 = uVar40;
                                if (uVar10 < uVar40) {
                                  uVar38 = uVar10;
                                }
                                local_238 = (ulong)(uVar38 + iVar29);
                                lVar31 = ~uVar39 + local_238;
                                auVar46._8_4_ = (int)lVar31;
                                auVar46._0_8_ = lVar31;
                                auVar46._12_4_ = (int)((ulong)lVar31 >> 0x20);
                                if (uVar40 <= uVar10) {
                                  uVar10 = uVar40;
                                }
                                pCVar17 = local_148 + uVar39;
                                uVar34 = 0;
                                do {
                                  auVar53._8_4_ = (int)uVar34;
                                  auVar53._0_8_ = uVar34;
                                  auVar53._12_4_ = (int)(uVar34 >> 0x20);
                                  auVar59 = (auVar53 | auVar62) ^ auVar63;
                                  iVar27 = SUB164(auVar46 ^ auVar63,0);
                                  bVar43 = iVar27 < auVar59._0_4_;
                                  iVar48 = SUB164(auVar46 ^ auVar63,4);
                                  iVar55 = auVar59._4_4_;
                                  if ((bool)(~(iVar48 < iVar55 || iVar55 == iVar48 && bVar43) & 1))
                                  {
                                    pCVar17[-3].price = 0x40000000;
                                  }
                                  if (iVar48 >= iVar55 && (iVar55 != iVar48 || !bVar43)) {
                                    pCVar17[-2].price = 0x40000000;
                                  }
                                  auVar59 = (auVar53 | auVar61) ^ auVar63;
                                  iVar55 = auVar59._4_4_;
                                  if (iVar55 <= iVar48 &&
                                      (iVar55 != iVar48 || auVar59._0_4_ <= iVar27)) {
                                    pCVar17[-1].price = 0x40000000;
                                    pCVar17->price = 0x40000000;
                                  }
                                  uVar34 = uVar34 + 4;
                                  pCVar17 = pCVar17 + 4;
                                } while ((((uVar10 + iVar29) - uVar39) + 3 & 0xfffffffffffffffc) !=
                                         uVar34);
                              }
                              uVar28 = 0xfffffffe;
                              do {
                                iVar29 = (int)uVar28;
                                uVar28 = (ulong)(iVar29 + 2);
                              } while (p->matches[uVar28] < (uint)uVar25);
                              uVar10 = p->matches[iVar29 + 3];
                              uVar39 = (ulong)uVar10;
                              iVar29 = 0x12;
                              if ((int)(uVar10 - 0x80000) < 0) {
                                iVar29 = 6;
                              }
                              uVar10 = (uint)p->g_FastPos[uVar10 >> (sbyte)iVar29] + iVar29 * 2;
                              local_22c = local_170;
                              local_158 = (ulong)(p->numFastBytes + 1);
                              uVar34 = uVar25;
                              paUVar36 = local_168;
                              do {
                                local_150 = (UInt16 (*) [16])(ulong)uVar10;
                                local_208 = uVar25;
                                do {
                                  uVar10 = (uint)uVar39;
                                  uVar38 = (uint)uVar34;
                                  iVar29 = 0;
                                  while( true ) {
                                    uVar40 = uVar38 + iVar29;
                                    uVar34 = (ulong)((uVar38 - 2) + iVar29);
                                    lVar31 = uVar34 * 4;
                                    if (4 < uVar40) {
                                      uVar34 = 3;
                                    }
                                    if (uVar10 < 0x80) {
                                      UVar8 = local_b0[uVar34][uVar39];
                                    }
                                    else {
                                      UVar8 = p->alignPrices[uVar10 & 0xf] +
                                              local_a8[uVar34][(long)local_150];
                                    }
                                    uVar9 = *(int *)((long)*paUVar36 + lVar31 + local_180) +
                                            (UInt32)local_200 + UVar8;
                                    uVar41 = (int)local_1d8 + uVar38 + iVar29 + 1;
                                    if (uVar9 < pCVar22[uVar41].price) {
                                      pCVar17 = pCVar22 + uVar41;
                                      pCVar17->price = uVar9;
                                      pCVar17->posPrev = (UInt32)local_228;
                                      pCVar17->backPrev = uVar10 + 4;
                                      pCVar17->prev1IsChar = 0;
                                    }
                                    if (uVar40 == p->matches[uVar28]) break;
                                    iVar29 = iVar29 + 1;
                                  }
                                  uVar39 = (ulong)((int)local_208 + iVar29 + 1);
                                  local_1e4 = uVar38 + iVar29 + 1;
                                  uVar41 = (int)local_158 + uVar40;
                                  if (local_12c <= uVar41) {
                                    uVar41 = local_12c;
                                  }
                                  uVar34 = (ulong)local_1e4;
                                  if (local_1e4 < uVar41) {
                                    uVar34 = uVar39;
                                    do {
                                      if (local_190[uVar34] != local_190[uVar34 - (uVar10 + 1)])
                                      break;
                                      uVar34 = uVar34 + 1;
                                    } while (uVar34 < uVar41);
                                  }
                                  iVar27 = (int)uVar34;
                                  uVar41 = (~uVar38 + iVar27) - iVar29;
                                  local_1c0 = uVar28;
                                  local_188 = local_208;
                                  if (1 < uVar41) {
                                    local_e8 = (ulong)*(uint *)(kMatchNextStates + local_198 * 4);
                                    uVar30 = uVar40 + (int)local_100;
                                    local_174 = p->pbMask;
                                    local_1f8 = (Byte *)(ulong)(local_174 & uVar30);
                                    bVar7 = (byte)p->lc;
                                    local_e0 = CONCAT44(local_e0._4_4_,
                                                        p->ProbPrices
                                                        [local_1c8[local_e8][(long)local_1f8] >> 4])
                                    ;
                                    local_208 = uVar39;
                                    local_140 = (ulong)uVar41;
                                    UVar8 = LitEnc_GetPriceMatched
                                                      (p->litProbs +
                                                       ((uint)(local_190[(uVar38 + iVar29) - 1] >>
                                                              (8 - bVar7 & 0x1f)) +
                                                       ((uVar30 & p->lpMask) << (bVar7 & 0x1f))) *
                                                       0x300,(uint)local_190[uVar40],
                                                       (uint)local_190[(ulong)uVar40 -
                                                                       (ulong)(uVar10 + 1)],
                                                       local_220);
                                    auVar63 = _DAT_001a2020;
                                    auVar62 = _DAT_001a2010;
                                    auVar61 = _DAT_001a2000;
                                    uVar41 = *(uint *)(kLiteralNextStates + local_e8 * 4);
                                    local_1f8 = (Byte *)(ulong)((int)local_1f8 + 1U & local_174);
                                    iVar48 = *(int *)((long)p->ProbPrices +
                                                     (ulong)(local_1c8[uVar41][(long)local_1f8] >> 2
                                                             & 0xfffffffc ^ 0x1fc));
                                    iVar55 = *(int *)((long)p->ProbPrices +
                                                     (ulong)(p->isRep[uVar41] >> 2 & 0xfffffffc ^
                                                            0x1fc));
                                    uVar30 = (int)local_1d8 + uVar40 + (int)local_140 + 2;
                                    if ((uint)local_238 < uVar30) {
                                      local_140 = CONCAT44(local_140._4_4_,UVar8);
                                      uVar39 = local_238 & 0xffffffff;
                                      local_238 = (ulong)((UInt32)local_228 + iVar27);
                                      lVar35 = local_238 - uVar39;
                                      lVar31 = lVar35 + -1;
                                      auVar47._8_4_ = (int)lVar31;
                                      auVar47._0_8_ = lVar31;
                                      auVar47._12_4_ = (int)((ulong)lVar31 >> 0x20);
                                      pCVar22 = local_148 + uVar39;
                                      uVar39 = 0;
                                      do {
                                        auVar54._8_4_ = (int)uVar39;
                                        auVar54._0_8_ = uVar39;
                                        auVar54._12_4_ = (int)(uVar39 >> 0x20);
                                        auVar59 = (auVar54 | auVar62) ^ auVar63;
                                        iVar56 = SUB164(auVar47 ^ auVar63,0);
                                        bVar43 = iVar56 < auVar59._0_4_;
                                        iVar58 = SUB164(auVar47 ^ auVar63,4);
                                        iVar60 = auVar59._4_4_;
                                        if ((bool)(~(iVar58 < iVar60 || iVar60 == iVar58 && bVar43)
                                                  & 1)) {
                                          pCVar22[-3].price = 0x40000000;
                                        }
                                        if (iVar58 >= iVar60 && (iVar60 != iVar58 || !bVar43)) {
                                          pCVar22[-2].price = 0x40000000;
                                        }
                                        auVar59 = (auVar54 | auVar61) ^ auVar63;
                                        iVar60 = auVar59._4_4_;
                                        if (iVar60 <= iVar58 &&
                                            (iVar60 != iVar58 || auVar59._0_4_ <= iVar56)) {
                                          pCVar22[-1].price = 0x40000000;
                                          pCVar22->price = 0x40000000;
                                        }
                                        uVar39 = uVar39 + 4;
                                        pCVar22 = pCVar22 + 4;
                                      } while ((lVar35 + 3U & 0xfffffffffffffffc) != uVar39);
                                    }
                                    uVar41 = (int)local_e0 + uVar9 + UVar8 + iVar55 + iVar48 +
                                             local_110[(long)local_1f8]
                                             [((iVar27 - uVar38) - iVar29) - 3] +
                                             local_220[local_1a0[uVar41] >> 4] +
                                             *(int *)((long)local_220 +
                                                     (ulong)(local_160[uVar41][(long)local_1f8] >> 2
                                                             & 0xfffffffc ^ 0x1fc));
                                    paUVar36 = local_168;
                                    pCVar22 = local_210;
                                    uVar39 = local_208;
                                    if (uVar41 < local_210[uVar30].price) {
                                      pCVar17 = local_210 + uVar30;
                                      pCVar17->price = uVar41;
                                      pCVar17->posPrev = (int)local_1d8 + uVar40 + 2;
                                      pCVar17->backPrev = 0;
                                      pCVar17->prev1IsChar = 1;
                                      pCVar17->prev2 = 1;
                                      pCVar17->posPrev2 = (UInt32)local_228;
                                      pCVar17->backPrev2 = uVar10 + 4;
                                    }
                                  }
                                  local_208 = uVar39;
                                  uVar10 = (int)local_1c0 + 2;
                                  uVar28 = (ulong)uVar10;
                                  lVar31 = local_1f0;
                                  uVar34 = local_228;
                                  uVar39 = local_1e0;
                                  if (uVar10 == local_22c) goto LAB_0019b67b;
                                  uVar10 = p->matches[(int)local_1c0 + 3];
                                  uVar39 = (ulong)uVar10;
                                  uVar34 = (ulong)local_1e4;
                                } while (uVar39 < 0x80);
                                iVar27 = 0x12;
                                if ((int)(uVar10 - 0x80000) < 0) {
                                  iVar27 = 6;
                                }
                                uVar10 = (uint)p->g_FastPos[uVar10 >> (sbyte)iVar27] + iVar27 * 2;
                                uVar25 = (ulong)((int)local_188 + iVar29 + 1);
                                uVar34 = (ulong)(uVar38 + iVar29 + 1);
                              } while( true );
                            }
                          }
LAB_0019b67b:
                          local_1e0 = uVar39;
                          lVar31 = lVar31 + 1;
                          local_1e0 = (ulong)((int)local_1e0 - 1);
                          local_100 = (ulong)((int)local_100 + 1);
                          uVar39 = local_218;
                          uVar10 = (uint)local_238;
                        } while ((UInt32)lVar31 != (uint)local_238);
                        UVar8 = Backward(p,&local_23c,uVar10);
                        uVar34 = (ulong)UVar8;
                        uVar28 = (ulong)local_23c;
                        goto LAB_001995c5;
                      }
                      local_23c = (UInt32)uVar28;
                      goto LAB_001991a0;
                    }
                    local_23c = p->matches[local_16c - 1] + 4;
                    uVar28 = (ulong)local_23c;
                    UVar12 = UVar8 - 1;
                    if (UVar12 == 0) goto LAB_001995bf;
                    p->additionalOffset = p->additionalOffset + UVar12;
                    (*(p->matchFinder).Skip)(p->matchFinderObj,UVar12);
                    uVar34 = (ulong)UVar8;
                  }
                  else {
                    UVar8 = uVar10 - 1;
                    local_23c = (uint)uVar28;
                    if (UVar8 == 0) {
LAB_0019957c:
                      uVar34 = 1;
                    }
                    else {
                      p->additionalOffset = p->additionalOffset + UVar8;
                      (*(p->matchFinder).Skip)(p->matchFinderObj,UVar8);
                    }
                  }
                }
              }
              else {
                UVar8 = local_210[uVar10].posPrev;
                local_23c = local_210[uVar10].backPrev;
                uVar28 = (ulong)local_23c;
                p->optimumCurrentIndex = UVar8;
                uVar34 = (ulong)(UVar8 - uVar10);
              }
            }
            else {
              if (p->additionalOffset == 0) {
                UVar8 = ReadMatchDistances(p,local_1b8);
              }
              else {
                UVar8 = p->longestMatchLength;
                local_1b8[0] = p->numPairs;
              }
              uVar10 = p->numAvail;
              if (uVar10 < 2) {
LAB_0019919b:
                uVar28 = 0xffffffff;
LAB_001991a0:
                uVar34 = 1;
                uVar39 = local_218;
              }
              else {
                uVar38 = 0x111;
                if (uVar10 < 0x111) {
                  uVar38 = uVar10;
                }
                pBVar15 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                uVar39 = local_218;
                uVar34 = 1;
                if (uVar38 < 4) {
                  uVar38 = 3;
                }
                uVar28 = 0;
                uVar42 = 0;
                uVar40 = 0;
                do {
                  if ((pBVar15[-1] == pBVar15[~(ulong)(local_138[uVar28] + 1)]) &&
                     (lVar31 = -(ulong)(local_138[uVar28] + 1), *pBVar15 == pBVar15[lVar31])) {
                    uVar25 = 2;
                    if (uVar10 != 2) {
                      uVar24 = 2;
                      do {
                        uVar25 = uVar24;
                        if (pBVar15[uVar24 - 1] != pBVar15[uVar24 + lVar31 + -1]) break;
                        uVar24 = uVar24 + 1;
                        uVar25 = (ulong)uVar38;
                      } while (uVar38 != uVar24);
                    }
                    UVar12 = (UInt32)uVar25;
                    uVar41 = (uint)uVar28;
                    if (p->numFastBytes <= UVar12) goto LAB_00199536;
                    if (uVar40 < UVar12) {
                      uVar42 = uVar28 & 0xffffffff;
                      uVar40 = UVar12;
                    }
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != 4);
                UVar12 = UVar8;
                if (UVar8 < p->numFastBytes) {
                  uVar38 = 0;
                  if (1 < UVar8) {
                    uVar34 = (ulong)local_1b8[0];
                    uVar38 = p->matches[local_1b8[0] - 1];
                    if (2 < uVar34) {
                      pUVar19 = local_a0 + uVar34;
                      uVar28 = uVar34 + 0xfffffffc;
                      do {
                        UVar12 = p->matches[uVar28 & 0xffffffff];
                        if ((UVar8 != UVar12 + 1) || (uVar41 = *pUVar19, uVar38 >> 7 <= uVar41))
                        break;
                        uVar9 = (int)uVar34 - 2;
                        uVar34 = (ulong)uVar9;
                        pUVar19 = pUVar19 + -2;
                        uVar28 = uVar28 - 2;
                        UVar8 = UVar12;
                        uVar38 = uVar41;
                      } while (2 < uVar9);
                    }
                    UVar11 = UVar8;
                    if (0x7f < uVar38) {
                      UVar11 = 1;
                    }
                    UVar12 = UVar8;
                    if (UVar8 == 2) {
                      UVar12 = UVar11;
                    }
                  }
                  if ((uVar40 < 2) ||
                     (((uVar40 + 1 < UVar12 && ((uVar40 + 2 < UVar12 || (uVar38 < 0x200)))) &&
                      ((uVar40 + 3 < UVar12 || (uVar38 < 0x8000)))))) {
                    if (uVar10 == 2) goto LAB_0019919b;
                    if (UVar12 < 2) {
LAB_00199d72:
                      uVar34 = 1;
                      uVar28 = 0xffffffff;
                      goto LAB_001995c5;
                    }
                    UVar8 = ReadMatchDistances(p,local_98);
                    p->longestMatchLength = UVar8;
                    if (1 < UVar8) {
                      uVar10 = p->matches[p->numPairs - 1];
                      if ((UVar8 < UVar12) || (uVar38 <= uVar10)) {
                        if ((UVar12 + 1 < UVar8) || (UVar8 == UVar12 + 1 && uVar10 >> 7 <= uVar38))
                        goto LAB_00199d72;
                        if (((UVar12 < 3) || (UVar8 + 1 < UVar12)) || (uVar38 >> 7 <= uVar10))
                        goto LAB_00199ce3;
                      }
LAB_0019951b:
                      uVar28 = 0xffffffff;
                      goto LAB_001995bf;
                    }
LAB_00199ce3:
                    pBVar15 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                    lVar31 = 0;
                    do {
                      if ((pBVar15[-1] == pBVar15[~(ulong)(local_138[lVar31] + 1)]) &&
                         (lVar35 = -(ulong)(local_138[lVar31] + 1), *pBVar15 == pBVar15[lVar35])) {
                        if (UVar12 - 1 < 3) goto LAB_0019951b;
                        lVar37 = 0;
                        while (pBVar15[lVar37 + 1] == pBVar15[lVar37 + lVar35 + 1]) {
                          lVar37 = lVar37 + 1;
                          if ((ulong)(UVar12 - 1) - 2 == lVar37) goto LAB_0019951b;
                        }
                      }
                      lVar31 = lVar31 + 1;
                    } while (lVar31 != 4);
                    local_23c = uVar38 + 4;
                    uVar28 = (ulong)local_23c;
                    UVar8 = UVar12 - 2;
                    if (UVar8 == 0) {
                      uVar34 = 2;
                      goto LAB_001995c5;
                    }
                  }
                  else {
                    UVar8 = uVar40 - 1;
                    UVar12 = uVar40;
                    local_23c = (uint)uVar42;
                  }
                }
                else {
                  uVar41 = p->matches[local_1b8[0] - 1] + 4;
                  uVar28 = (ulong)uVar41;
LAB_00199536:
                  UVar8 = UVar12 - 1;
                  local_23c = uVar41;
                  if (UVar8 == 0) goto LAB_001995c5;
                }
                UVar11 = local_23c;
                p->additionalOffset = p->additionalOffset + UVar8;
                (*(p->matchFinder).Skip)(p->matchFinderObj,UVar8);
                uVar28 = (ulong)UVar11;
                uVar34 = (ulong)UVar12;
              }
            }
LAB_001995c5:
            pCVar5 = local_1d0;
            uVar38 = (uint)uVar39;
            uVar40 = p->pbMask & uVar38;
            uVar10 = (uint)uVar28;
            local_238 = uVar34;
            if (((int)uVar34 == 1) && (uVar10 == 0xffffffff)) {
              RangeEnc_EncodeBit(local_1d0,local_1c8[p->state] + uVar40,0);
              pBVar15 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
              pCVar5 = local_1d0;
              bVar7 = (byte)p->lc;
              iVar29 = (uint)(pBVar15[-1 - (ulong)p->additionalOffset] >> (8 - bVar7 & 0x1f)) +
                       ((p->lpMask & uVar38) << (bVar7 & 0x1f));
              pUVar3 = p->litProbs;
              uVar10 = (uint)pBVar15[-(ulong)p->additionalOffset];
              if (p->state < 7) {
                uVar10 = uVar10 | 0x100;
                do {
                  RangeEnc_EncodeBit(pCVar5,(UInt16 *)
                                            ((long)pUVar3 +
                                            (ulong)(uVar10 >> 7 & 0x1fffffe) +
                                            (ulong)(uint)(iVar29 * 0x300) * 2),uVar10 >> 7 & 1);
                  bVar43 = uVar10 < 0x8000;
                  uVar10 = uVar10 * 2;
                } while (bVar43);
              }
              else {
                uVar38 = (uint)(pBVar15 + -(ulong)p->additionalOffset)[~(ulong)*local_138];
                uVar40 = 0x100;
                uVar10 = uVar10 | 0x100;
                do {
                  uVar38 = uVar38 * 2;
                  RangeEnc_EncodeBit(pCVar5,pUVar3 + (ulong)(uint)(iVar29 * 0x300) +
                                                     (ulong)((uVar10 >> 8) + uVar40 +
                                                            (uVar38 & uVar40)),uVar10 >> 7 & 1);
                  uVar40 = uVar40 & ~(uVar10 * 2 ^ uVar38);
                  bVar43 = uVar10 < 0x8000;
                  uVar10 = uVar10 * 2;
                } while (bVar43);
              }
              p->state = *(UInt32 *)(kLiteralNextStates + (ulong)p->state * 4);
              iVar29 = (int)local_238;
              uVar38 = (uint)local_218;
            }
            else {
              RangeEnc_EncodeBit(local_1d0,local_1c8[p->state] + uVar40,1);
              if (uVar10 < 4) {
                RangeEnc_EncodeBit(pCVar5,local_f0 + p->state,1);
                if (uVar10 == 0) {
                  iVar29 = (int)local_238;
                  RangeEnc_EncodeBit(pCVar5,local_1a0 + p->state,0);
                  RangeEnc_EncodeBit(pCVar5,local_160[p->state] + uVar40,(uint)(iVar29 != 1));
                }
                else {
                  UVar8 = p->reps[uVar28 & 0xffffffff];
                  RangeEnc_EncodeBit(pCVar5,local_1a0 + p->state,1);
                  if (uVar10 == 1) {
                    RangeEnc_EncodeBit(pCVar5,local_60 + p->state,0);
                  }
                  else {
                    RangeEnc_EncodeBit(pCVar5,local_60 + p->state,1);
                    RangeEnc_EncodeBit(pCVar5,local_80 + p->state,uVar10 - 2);
                    if (uVar10 == 3) {
                      p->reps[3] = p->reps[2];
                    }
                    p->reps[2] = p->reps[1];
                  }
                  iVar29 = (int)local_238;
                  p->reps[1] = p->reps[0];
                  p->reps[0] = UVar8;
                }
                if (iVar29 == 1) {
                  uVar10 = p->state;
                  puVar20 = kShortRepNextStates;
                  iVar29 = 1;
                }
                else {
                  LenEnc_Encode2(local_68,local_1d0,iVar29 - 2,uVar40,(uint)(p->fastMode == 0),
                                 local_220);
                  iVar29 = (int)local_238;
                  uVar10 = p->state;
                  puVar20 = kRepNextStates;
                }
                p->state = *(UInt32 *)(puVar20 + (ulong)uVar10 * 4);
              }
              else {
                RangeEnc_EncodeBit(pCVar5,local_f0 + p->state,0);
                p->state = *(UInt32 *)(kMatchNextStates + (ulong)p->state * 4);
                uVar38 = (int)local_238 - 2;
                LenEnc_Encode2(local_50,pCVar5,uVar38,uVar40,(uint)(p->fastMode == 0),local_220);
                paUVar6 = local_58;
                pCVar5 = local_1d0;
                local_23c = uVar10 - 4;
                local_200 = CONCAT44(local_200._4_4_,local_23c);
                if (local_23c < 0x80) {
                  uVar10 = (uint)p->g_FastPos[local_23c];
                }
                else {
                  iVar29 = 0x12;
                  if ((int)(uVar10 - 0x80004) < 0) {
                    iVar29 = 6;
                  }
                  uVar10 = (uint)p->g_FastPos[local_23c >> (sbyte)iVar29] + iVar29 * 2;
                }
                if (4 < (uint)local_238) {
                  uVar38 = 3;
                }
                uVar39 = 1;
                uVar40 = 5;
                do {
                  bVar43 = (uVar10 >> (uVar40 & 0x1f) & 1) != 0;
                  RangeEnc_EncodeBit(pCVar5,paUVar6[uVar38] + uVar39,(uint)bVar43);
                  pUVar3 = local_90;
                  p_00 = local_1d0;
                  uVar39 = (ulong)((uint)bVar43 + (int)uVar39 * 2);
                  bVar43 = uVar40 != 0;
                  uVar40 = uVar40 - 1;
                } while (bVar43);
                if (3 < uVar10) {
                  iVar29 = (uVar10 >> 1) - 1;
                  uVar38 = (uVar10 & 1 | 2) << ((byte)iVar29 & 0x1f);
                  uVar40 = (UInt32)local_200 - uVar38;
                  uVar39 = (ulong)uVar40;
                  if (uVar10 < 0xe) {
                    uVar40 = 1;
                    do {
                      uVar41 = (uint)uVar39 & 1;
                      RangeEnc_EncodeBit(p_00,(UInt16 *)
                                              ((long)pUVar3 +
                                              (ulong)uVar40 * 2 +
                                              ((ulong)uVar38 * 2 - (ulong)(uVar10 * 2)) + -2),uVar41
                                        );
                      uVar40 = uVar41 + uVar40 * 2;
                      uVar39 = uVar39 >> 1;
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                  }
                  else {
                    RangeEnc_EncodeDirectBits(local_1d0,uVar40 >> 4,(uVar10 >> 1) - 5);
                    pUVar3 = local_88;
                    uVar39 = (ulong)(uVar40 & 0xf);
                    uVar10 = 1;
                    iVar29 = 4;
                    do {
                      uVar38 = (uint)uVar39 & 1;
                      RangeEnc_EncodeBit(p_00,pUVar3 + uVar10,uVar38);
                      uVar10 = uVar38 + uVar10 * 2;
                      uVar39 = uVar39 >> 1;
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                    p->alignPriceCount = p->alignPriceCount + 1;
                  }
                }
                p->reps[3] = p->reps[2];
                *(undefined8 *)(p->reps + 1) = *(undefined8 *)p->reps;
                p->reps[0] = (UInt32)local_200;
                p->matchPriceCount = p->matchPriceCount + 1;
                uVar38 = (uint)local_218;
                iVar29 = (int)local_238;
              }
            }
            uVar39 = (ulong)(uVar38 + iVar29);
            pUVar19 = &p->additionalOffset;
            *pUVar19 = *pUVar19 - iVar29;
          } while (*pUVar19 != 0);
          if (p->fastMode == 0) {
            if (0x7f < p->matchPriceCount) {
              FillDistancesPrices(p);
            }
            if (0xf < p->alignPriceCount) {
              FillAlignPrices(p);
            }
          }
          UVar8 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
          if (UVar8 == 0) break;
          uVar10 = (uVar38 + iVar29) - (int)local_f8;
          if (local_cc == 0) {
            if (0x7fff < uVar10) {
              p->nowPos64 = p->nowPos64 + (ulong)uVar10;
              if (p->result != 0) {
                return p->result;
              }
              if ((p->rc).res != 0) goto LAB_00198e57;
              if ((p->matchFinderBase).result == 0) {
                return 0;
              }
              goto LAB_00198e7d;
            }
          }
          else if ((local_d0 <= uVar10 + 0x112c) ||
                  (local_48 <=
                   (p->rc).buf +
                   (p->rc).cacheSize + ((p->rc).processed - (long)(p->rc).bufBase) + 0x2000)) break;
        } while( true );
      }
      UVar8 = (UInt32)uVar39;
      p->nowPos64 = p->nowPos64 + (ulong)(UVar8 - (int)local_f8);
LAB_0019b8c2:
      SVar14 = Flush(p,UVar8);
      return SVar14;
    }
  }
  else {
LAB_00198e57:
    p->result = 9;
    if ((p->matchFinderBase).result == 0) {
      iVar29 = 9;
      goto LAB_00198e8d;
    }
  }
LAB_00198e7d:
  p->result = 8;
  iVar29 = 8;
LAB_00198e8d:
  p->finished = 1;
  return iVar29;
}

Assistant:

static SRes LzmaEnc_CodeOneBlock(CLzmaEnc* p, Bool useLimits, UInt32 maxPackSize, UInt32 maxUnpackSize) {
  UInt32 nowPos32, startPos32;
  if (p->inStream != 0) {
    p->matchFinderBase.stream = p->inStream;
    p->matchFinder.Init(p->matchFinderObj);
    p->inStream = 0;
  }

  if (p->finished)
    return p->result;
  RINOK(CheckErrors(p));

  nowPos32 = (UInt32)p->nowPos64;
  startPos32 = nowPos32;

  if (p->nowPos64 == 0) {
    UInt32 numPairs;
    Byte curByte;
    if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
      return Flush(p, nowPos32);
    ReadMatchDistances(p, &numPairs);
    RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][0], 0);
    p->state = kLiteralNextStates[p->state];
    curByte = p->matchFinder.GetIndexByte(p->matchFinderObj, 0 - p->additionalOffset);
    LitEnc_Encode(&p->rc, p->litProbs, curByte);
    p->additionalOffset--;
    nowPos32++;
  }

  if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) != 0)
    for (;;) {
      UInt32 pos, len, posState;

      if (p->fastMode)
        len = GetOptimumFast(p, &pos);
      else
        len = GetOptimum(p, nowPos32, &pos);

#ifdef SHOW_STAT2
      printf("\n pos = %4X,   len = %d   pos = %d", nowPos32, len, pos);
#endif

      posState = nowPos32 & p->pbMask;
      if (len == 1 && pos == (UInt32)-1) {
        Byte curByte;
        CLzmaProb* probs;
        const Byte* data;

        RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 0);
        data = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset;
        curByte = *data;
        probs = LIT_PROBS(nowPos32, *(data - 1));
        if (IsCharState(p->state))
          LitEnc_Encode(&p->rc, probs, curByte);
        else
          LitEnc_EncodeMatched(&p->rc, probs, curByte, *(data - p->reps[0] - 1));
        p->state = kLiteralNextStates[p->state];
      } else {
        RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 1);
        if (pos < LZMA_NUM_REPS) {
          RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 1);
          if (pos == 0) {
            RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 0);
            RangeEnc_EncodeBit(&p->rc, &p->isRep0Long[p->state][posState], ((len == 1) ? 0 : 1));
          } else {
            UInt32 distance = p->reps[pos];
            RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 1);
            if (pos == 1)
              RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 0);
            else {
              RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 1);
              RangeEnc_EncodeBit(&p->rc, &p->isRepG2[p->state], pos - 2);
              if (pos == 3)
                p->reps[3] = p->reps[2];
              p->reps[2] = p->reps[1];
            }
            p->reps[1] = p->reps[0];
            p->reps[0] = distance;
          }
          if (len == 1)
            p->state = kShortRepNextStates[p->state];
          else {
            LenEnc_Encode2(&p->repLenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
            p->state = kRepNextStates[p->state];
          }
        } else {
          UInt32 posSlot;
          RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 0);
          p->state = kMatchNextStates[p->state];
          LenEnc_Encode2(&p->lenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
          pos -= LZMA_NUM_REPS;
          GetPosSlot(pos, posSlot);
          RcTree_Encode(&p->rc, p->posSlotEncoder[GetLenToPosState(len)], kNumPosSlotBits, posSlot);

          if (posSlot >= kStartPosModelIndex) {
            UInt32 footerBits = ((posSlot >> 1) - 1);
            UInt32 base = ((2 | (posSlot & 1)) << footerBits);
            UInt32 posReduced = pos - base;

            if (posSlot < kEndPosModelIndex)
              RcTree_ReverseEncode(&p->rc, p->posEncoders + base - posSlot - 1, footerBits, posReduced);
            else {
              RangeEnc_EncodeDirectBits(&p->rc, posReduced >> kNumAlignBits, footerBits - kNumAlignBits);
              RcTree_ReverseEncode(&p->rc, p->posAlignEncoder, kNumAlignBits, posReduced & kAlignMask);
              p->alignPriceCount++;
            }
          }
          p->reps[3] = p->reps[2];
          p->reps[2] = p->reps[1];
          p->reps[1] = p->reps[0];
          p->reps[0] = pos;
          p->matchPriceCount++;
        }
      }
      p->additionalOffset -= len;
      nowPos32 += len;
      if (p->additionalOffset == 0) {
        UInt32 processed;
        if (!p->fastMode) {
          if (p->matchPriceCount >= (1 << 7))
            FillDistancesPrices(p);
          if (p->alignPriceCount >= kAlignTableSize)
            FillAlignPrices(p);
        }
        if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
          break;
        processed = nowPos32 - startPos32;
        if (useLimits) {
          if (processed + kNumOpts + 300 >= maxUnpackSize ||
              RangeEnc_GetProcessed(&p->rc) + kNumOpts * 2 >= maxPackSize)
            break;
        } else if (processed >= (1 << 15)) {
          p->nowPos64 += nowPos32 - startPos32;
          return CheckErrors(p);
        }
      }
    }
  p->nowPos64 += nowPos32 - startPos32;
  return Flush(p, nowPos32);
}